

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O3

int stbtt__run_charstring(stbtt_fontinfo *info,int glyph_index,stbtt__csctx *c)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  byte bVar11;
  uchar *puVar12;
  stbtt__buf sVar13;
  float fVar14;
  float fVar15;
  stbtt_uint32 sVar16;
  ulong uVar17;
  uint uVar18;
  uint uVar19;
  int iVar20;
  ulong uVar21;
  ulong uVar22;
  uint uVar23;
  uint uVar24;
  int iVar25;
  uint uVar26;
  uint uVar27;
  uint uVar28;
  long lVar29;
  int iVar30;
  long lVar31;
  uint uVar32;
  float fVar33;
  float dy1;
  float fVar34;
  float dy2;
  float fVar35;
  float fVar36;
  float fVar37;
  stbtt__buf sVar38;
  stbtt__buf sVar39;
  stbtt__buf b;
  undefined1 in_stack_fffffffffffffdc8 [12];
  int iVar40;
  stbtt__buf local_228;
  float local_218;
  int local_214;
  uchar *puVar41;
  ulong uVar42;
  float fStack_1cc;
  undefined8 local_1c8;
  undefined8 uStack_1c0;
  float s [48];
  stbtt__buf subr_stack [10];
  
  sVar38 = info->subrs;
  local_228 = stbtt__cff_index_get(info->charstrings,glyph_index);
  uVar21 = local_228._8_8_;
  uVar17 = uVar21 >> 0x20;
  if (local_228.size <= local_228.cursor) {
switchD_001684d1_default:
    return 0;
  }
  iVar40 = 1;
  uVar42 = 0;
  puVar41 = (uchar *)0x0;
  uVar22 = 0;
  local_214 = 0;
LAB_00168122:
  fVar15 = s[10];
  dy2 = s[9];
  fVar14 = s[8];
  fVar36 = s[7];
  fVar37 = s[6];
  fVar35 = s[5];
  fVar34 = s[2];
  fVar33 = s[1];
  iVar20 = (int)uVar21;
  uVar21 = (long)iVar20 + 1;
  iVar25 = (int)uVar21;
  local_228.cursor = iVar25;
  bVar11 = local_228.data[iVar20];
  uVar18 = (uint)uVar22;
  iVar30 = (int)uVar17;
  switch(bVar11) {
  case 1:
  case 3:
  case 0x12:
  case 0x17:
    uVar42 = (ulong)(uint)((int)uVar42 + ((int)((int)(uVar22 >> 0x1f) + uVar18) >> 1));
    goto LAB_001687d3;
  case 2:
  case 9:
  case 0xd:
  case 0xf:
  case 0x10:
  case 0x11:
switchD_0016814f_caseD_2:
    if (bVar11 < 0x20) {
      return 0;
    }
    if (bVar11 == 0xff) goto LAB_0016825b;
  case 0x1c:
    local_228.cursor = iVar20;
    if (iVar30 < iVar20) {
      local_228.cursor = iVar30;
    }
    if (iVar20 < 0) {
      local_228.cursor = iVar30;
    }
    sVar16 = stbtt__cff_int(&local_228);
    fVar33 = (float)(int)(short)sVar16;
LAB_00168292:
    if (0x2f < (int)uVar18) {
      return 0;
    }
    uVar22 = (ulong)(uVar18 + 1);
    s[(int)uVar18] = fVar33;
    goto LAB_00168d41;
  case 4:
    if ((int)uVar18 < 1) {
      return 0;
    }
    fVar33 = s[uVar18 - 1];
    fVar34 = 0.0;
    goto LAB_00168797;
  case 5:
    if ((int)uVar18 < 2) {
      return 0;
    }
    uVar17 = 1;
    do {
      uVar2 = c->x;
      uVar7 = c->y;
      fVar33 = (float)uVar2 + (float)*(undefined8 *)(s + (uVar17 - 1));
      fVar34 = (float)uVar7 + (float)((ulong)*(undefined8 *)(s + (uVar17 - 1)) >> 0x20);
      c->x = fVar33;
      c->y = fVar34;
      stbtt__csctx_v(c,'\x02',(int)fVar33,(int)fVar34,0,0,0,0);
      uVar17 = uVar17 + 2;
    } while (uVar17 < uVar22);
    break;
  case 6:
    iVar30 = 0;
    if ((int)uVar18 < 1) {
      return 0;
    }
    for (; iVar30 < (int)uVar18; iVar30 = iVar30 + 1) {
      uVar4 = c->x;
      uVar9 = c->y;
      fVar33 = s[iVar30];
      c->x = fVar33 + (float)uVar4;
      c->y = (float)uVar9 + 0.0;
      stbtt__csctx_v(c,'\x02',(int)(fVar33 + (float)uVar4),(int)((float)uVar9 + 0.0),0,0,0,0);
      iVar30 = iVar30 + 1;
LAB_00168ce0:
      if ((int)uVar18 <= iVar30) break;
      uVar5 = c->x;
      uVar10 = c->y;
      fVar33 = s[iVar30];
      c->x = (float)uVar5 + 0.0;
      c->y = fVar33 + (float)uVar10;
      stbtt__csctx_v(c,'\x02',(int)((float)uVar5 + 0.0),(int)(fVar33 + (float)uVar10),0,0,0,0);
    }
    break;
  case 7:
    iVar30 = 0;
    if (0 < (int)uVar18) goto LAB_00168ce0;
    return 0;
  case 8:
    if ((int)uVar18 < 6) {
      return 0;
    }
    uVar17 = 5;
    do {
      stbtt__csctx_rccurve_to
                (c,(&fStack_1cc)[uVar17],*(float *)((long)&local_1c8 + uVar17 * 4),
                 *(float *)((long)&local_1c8 + uVar17 * 4 + 4),s[uVar17 - 2],s[uVar17 - 1],s[uVar17]
                );
      uVar17 = uVar17 + 6;
    } while (uVar17 < uVar22);
    break;
  case 10:
    iVar30 = 1;
    if (local_214 == 0) {
      uVar19 = (info->fdselect).size;
      if (uVar19 != 0) {
        puVar12 = (info->fdselect).data;
        uVar24 = 0;
        if ((int)uVar19 < 0) {
          uVar24 = uVar19;
        }
        if ((int)uVar19 < 1) {
LAB_00168a5f:
          uVar24 = uVar24 + glyph_index;
          uVar23 = uVar24;
          if ((int)uVar19 < (int)uVar24) {
            uVar23 = uVar19;
          }
          if ((int)uVar24 < 0) {
            uVar23 = uVar19;
          }
          uVar24 = 0;
          if ((int)uVar23 < (int)uVar19) {
            uVar24 = (uint)puVar12[(int)uVar23];
          }
        }
        else {
          if (puVar12[uVar24] == '\0') {
            uVar24 = 1;
            goto LAB_00168a5f;
          }
          if (puVar12[uVar24] == '\x03') {
            uVar23 = 0;
            iVar25 = 1;
            iVar30 = 2;
            do {
              if (iVar25 < (int)uVar19) {
                lVar29 = (long)iVar25;
                iVar25 = iVar25 + 1;
                uVar24 = (uint)puVar12[lVar29];
              }
              else {
                uVar24 = 0;
              }
              uVar23 = uVar23 << 8 | uVar24;
              iVar30 = iVar30 + -1;
            } while (iVar30 != 0);
            uVar26 = 0;
            iVar30 = 2;
            do {
              if (iVar25 < (int)uVar19) {
                lVar29 = (long)iVar25;
                iVar25 = iVar25 + 1;
                uVar24 = (uint)puVar12[lVar29];
              }
              else {
                uVar24 = 0;
              }
              uVar26 = uVar26 << 8 | uVar24;
              iVar30 = iVar30 + -1;
            } while (iVar30 != 0);
            if (0 < (int)uVar23) {
              uVar27 = 0;
              do {
                if (iVar25 < (int)uVar19) {
                  lVar29 = (long)iVar25;
                  iVar25 = iVar25 + 1;
                  uVar24 = (uint)puVar12[lVar29];
                }
                else {
                  uVar24 = 0;
                }
                uVar28 = 0;
                iVar30 = 2;
                do {
                  if (iVar25 < (int)uVar19) {
                    lVar29 = (long)iVar25;
                    iVar25 = iVar25 + 1;
                    uVar32 = (uint)puVar12[lVar29];
                  }
                  else {
                    uVar32 = 0;
                  }
                  uVar28 = uVar28 << 8 | uVar32;
                  iVar30 = iVar30 + -1;
                } while (iVar30 != 0);
                if (glyph_index < (int)uVar28 && (int)uVar26 <= glyph_index) goto LAB_00168a7c;
                uVar27 = uVar27 + 1;
                uVar26 = uVar28;
              } while (uVar27 != uVar23);
            }
          }
          uVar24 = 0xffffffff;
        }
LAB_00168a7c:
        stbtt__cff_index_get(info->fontdicts,uVar24);
        sVar38.size = iVar40;
        sVar38.data = (uchar *)in_stack_fffffffffffffdc8._0_8_;
        sVar38.cursor = in_stack_fffffffffffffdc8._8_4_;
        sVar13.cursor = (int)uVar42;
        sVar13.size = (int)(uVar42 >> 0x20);
        sVar13.data = puVar41;
        sVar38 = stbtt__get_subrs(sVar38,sVar13);
        iVar30 = 1;
      }
    }
    goto LAB_00168ab8;
  case 0xb:
    if ((int)puVar41 < 1) {
      return 0;
    }
    puVar41 = (uchar *)(ulong)((int)puVar41 - 1);
    local_228.data._4_4_ = *(undefined4 *)((long)&subr_stack[(long)puVar41].data + 4);
    local_228.data._0_4_ = *(undefined4 *)&subr_stack[(long)puVar41].data;
    local_228.cursor = subr_stack[(long)puVar41].cursor;
    local_228.size = subr_stack[(long)puVar41].size;
    goto LAB_00168d41;
  case 0xc:
    if (iVar30 <= iVar25) {
      return 0;
    }
    local_228.cursor = iVar20 + 2;
    switch(local_228.data[uVar21]) {
    case '\"':
      if ((int)uVar18 < 7) {
        return 0;
      }
      local_1c8 = CONCAT44(local_1c8._4_4_,s[4]);
      stbtt__csctx_rccurve_to(c,s[0],0.0,s[1],s[2],s[3],0.0);
      dy2 = -fVar34;
      dy1 = 0.0;
      fVar33 = 0.0;
      fVar34 = (float)local_1c8;
      break;
    case '#':
      if ((int)uVar18 < 0xd) {
        return 0;
      }
      local_1c8 = CONCAT44(local_1c8._4_4_,s[7]);
      local_218 = s[0xb];
      stbtt__csctx_rccurve_to(c,s[0],s[1],s[2],s[3],s[4],s[5]);
      fVar34 = fVar37;
      fVar33 = local_218;
      fVar35 = fVar14;
      dy1 = (float)local_1c8;
      fVar37 = fVar15;
      break;
    case '$':
      if ((int)uVar18 < 9) {
        return 0;
      }
      local_218 = s[3];
      local_1c8 = CONCAT44(local_1c8._4_4_,s[6]);
      stbtt__csctx_rccurve_to(c,s[0],s[1],s[2],s[3],s[4],0.0);
      dy1 = 0.0;
      fVar34 = fVar35;
      dy2 = fVar36;
      fVar33 = -(fVar33 + local_218 + fVar36);
      fVar35 = (float)local_1c8;
      fVar37 = fVar14;
      break;
    case '%':
      if ((int)uVar18 < 0xb) {
        return 0;
      }
      local_1c8 = CONCAT44(s[7],s[6]);
      uStack_1c0 = 0;
      fVar33 = s[0] + s[2] + s[4] + s[6] + s[8];
      fVar35 = s[1] + s[3] + s[5] + s[7] + s[9];
      fVar34 = ABS(fVar33);
      fStack_1cc = ABS(fVar35);
      fVar37 = s[10];
      if (fVar34 <= fStack_1cc) {
        fVar37 = -fVar33;
      }
      uVar18 = -(uint)(fStack_1cc < fVar34);
      fStack_1cc = (float)((uint)-fVar35 & (uint)fStack_1cc);
      uVar19 = ~uVar18 & (uint)s[10];
      stbtt__csctx_rccurve_to(c,s[0],s[1],s[2],s[3],s[4],s[5]);
      fVar34 = (float)local_1c8;
      fVar33 = (float)(uVar19 | (uint)-fVar35 & uVar18);
      fVar35 = fVar14;
      dy1 = local_1c8._4_4_;
      break;
    default:
      goto switchD_001684d1_default;
    }
    goto LAB_00168487;
  case 0xe:
    stbtt__csctx_close_shape(c);
    return 1;
  case 0x13:
  case 0x14:
    if (iVar40 != 0) {
      uVar42 = (ulong)(uint)((int)uVar42 + ((int)((int)(uVar22 >> 0x1f) + uVar18) >> 1));
    }
    iVar20 = (int)uVar42 + 7;
    iVar40 = (int)uVar42 + 0xe;
    if (-1 < iVar20) {
      iVar40 = iVar20;
    }
    iVar25 = (iVar40 >> 3) + iVar25;
    local_228.cursor = iVar25;
    if (iVar30 < iVar25) {
      local_228.cursor = iVar30;
    }
    if (iVar25 < 0) {
      local_228.cursor = iVar30;
    }
    goto LAB_001687cb;
  case 0x15:
    if ((int)uVar18 < 2) {
      return 0;
    }
    fVar34 = s[uVar18 - 2];
    fVar33 = s[uVar18 - 1];
    goto LAB_00168797;
  case 0x16:
    if ((int)uVar18 < 1) {
      return 0;
    }
    fVar34 = s[uVar18 - 1];
    fVar33 = 0.0;
LAB_00168797:
    stbtt__csctx_rmove_to(c,fVar34,fVar33);
LAB_001687cb:
    iVar40 = 0;
LAB_001687d3:
    uVar22 = 0;
    goto LAB_00168d41;
  case 0x18:
    if ((int)uVar18 < 8) {
      return 0;
    }
    lVar29 = -6;
    do {
      lVar31 = lVar29;
      stbtt__csctx_rccurve_to
                (c,s[lVar31 + 6],s[lVar31 + 7],s[lVar31 + 8],s[lVar31 + 9],s[lVar31 + 10],
                 s[lVar31 + 0xb]);
      lVar29 = lVar31 + 6;
    } while (lVar31 + 6 < (long)(uVar22 - 0xd));
    if ((int)uVar18 <= (int)lVar31 + 0xd) {
      return 0;
    }
    uVar3 = c->x;
    uVar8 = c->y;
    fVar33 = (float)uVar3 + (float)*(undefined8 *)(s + lVar31 + 0xc);
    fVar34 = (float)uVar8 + (float)((ulong)*(undefined8 *)(s + lVar31 + 0xc) >> 0x20);
    c->x = fVar33;
    c->y = fVar34;
    stbtt__csctx_v(c,'\x02',(int)fVar33,(int)fVar34,0,0,0,0);
    break;
  case 0x19:
    if ((int)uVar18 < 8) {
      return 0;
    }
    uVar17 = 2;
    do {
      uVar21 = uVar17;
      uVar1 = c->x;
      uVar6 = c->y;
      fVar33 = (float)uVar1 + (float)*(undefined8 *)(s + (uVar21 - 2));
      fVar34 = (float)uVar6 + (float)((ulong)*(undefined8 *)(s + (uVar21 - 2)) >> 0x20);
      c->x = fVar33;
      c->y = fVar34;
      stbtt__csctx_v(c,'\x02',(int)fVar33,(int)fVar34,0,0,0,0);
      uVar17 = uVar21 + 2;
    } while (uVar21 + 1 < (ulong)(uVar18 - 6));
    if ((int)uVar18 <= (int)(uVar21 + 5)) {
      return 0;
    }
    fVar34 = s[uVar21];
    dy2 = s[(int)uVar17 + 1];
    fVar33 = s[uVar21 + 5 & 0xffffffff];
    fVar35 = s[uVar17 & 0xffffffff];
    dy1 = s[uVar21 + 1];
    fVar37 = s[(int)uVar17 + 2];
LAB_00168487:
    stbtt__csctx_rccurve_to(c,fVar34,dy1,fVar35,dy2,fVar37,fVar33);
    break;
  case 0x1a:
  case 0x1b:
    if ((int)uVar18 < 4) {
      return 0;
    }
    uVar17 = (ulong)(uVar18 & 1);
    if ((uVar18 & 1) + 3 < uVar18) {
      fVar33 = 0.0;
      if ((uVar22 & 1) != 0) {
        fVar33 = s[0];
      }
      do {
        iVar30 = (int)uVar17;
        fVar34 = s[uVar17];
        if (bVar11 == 0x1b) {
          fVar37 = fVar34;
          fVar36 = 0.0;
          fVar35 = s[iVar30 + 3];
          fVar34 = fVar33;
        }
        else {
          fVar35 = 0.0;
          fVar37 = fVar33;
          fVar36 = s[iVar30 + 3];
        }
        stbtt__csctx_rccurve_to(c,fVar37,fVar34,s[uVar17 + 1],s[uVar17 + 2],fVar35,fVar36);
        uVar17 = uVar17 + 4;
        fVar33 = 0.0;
      } while (iVar30 + 7 < (int)uVar18);
    }
    break;
  case 0x1d:
    iVar30 = local_214;
LAB_00168ab8:
    if ((int)uVar18 < 1) {
      return 0;
    }
    iVar25 = (int)puVar41;
    if (9 < iVar25) {
      return 0;
    }
    uVar22 = (ulong)(uVar18 - 1);
    fVar33 = s[uVar22];
    *(undefined4 *)&subr_stack[iVar25].data = local_228.data._0_4_;
    *(undefined4 *)((long)&subr_stack[iVar25].data + 4) = local_228.data._4_4_;
    subr_stack[iVar25].cursor = local_228.cursor;
    subr_stack[iVar25].size = local_228.size;
    sVar13 = sVar38;
    if (bVar11 != 10) {
      sVar13 = info->gsubrs;
    }
    b.data = sVar13.data;
    puVar41 = (uchar *)(ulong)(iVar25 + 1);
    uVar19 = sVar13.size;
    uVar24 = (int)uVar19 >> 0x1f & uVar19;
    uVar18 = 0;
    iVar25 = 2;
    do {
      if ((int)uVar24 < (int)uVar19) {
        lVar29 = (long)(int)uVar24;
        uVar24 = uVar24 + 1;
        uVar23 = (uint)b.data[lVar29];
      }
      else {
        uVar23 = 0;
      }
      uVar18 = uVar18 << 8 | uVar23;
      iVar25 = iVar25 + -1;
    } while (iVar25 != 0);
    uVar19 = (uint)(0x4d7 < (int)uVar18) << 10 | 0x6b;
    if (0x846b < (int)uVar18) {
      uVar19 = 0x8000;
    }
    iVar25 = uVar19 + (int)fVar33;
    sVar39 = (stbtt__buf)ZEXT816(0);
    if (iVar25 < (int)uVar18 && -1 < iVar25) {
      b._8_8_ = (ulong)uVar24 | sVar13._8_8_ & 0xffffffff00000000;
      sVar39 = stbtt__cff_index_get(b,iVar25);
    }
    if (sVar39._8_8_ >> 0x20 == 0) {
      return 0;
    }
    local_228.size = sVar39.size;
    local_228.data = sVar39.data;
    local_228.cursor = 0;
    local_214 = iVar30;
    goto LAB_00168d41;
  case 0x1e:
    iVar25 = 0;
    if ((int)uVar18 < 4) {
      return 0;
    }
    while (iVar25 + 3 < (int)uVar18) {
      iVar30 = iVar25 + 4;
      fVar33 = 0.0;
      if (uVar18 - iVar25 == 5) {
        fVar33 = s[iVar30];
      }
      stbtt__csctx_rccurve_to
                (c,0.0,s[iVar25],s[(long)iVar25 + 1],s[(long)iVar25 + 2],s[iVar25 + 3],fVar33);
LAB_00168c33:
      if ((int)uVar18 <= iVar30 + 3) break;
      iVar25 = iVar30 + 4;
      fVar33 = 0.0;
      if (uVar18 - iVar30 == 5) {
        fVar33 = s[iVar25];
      }
      stbtt__csctx_rccurve_to
                (c,s[iVar30],0.0,s[(long)iVar30 + 1],s[(long)iVar30 + 2],fVar33,s[iVar30 + 3]);
    }
    break;
  case 0x1f:
    iVar30 = 0;
    if (3 < (int)uVar18) goto LAB_00168c33;
    return 0;
  default:
    if (bVar11 != 0xff) goto switchD_0016814f_caseD_2;
LAB_0016825b:
    uVar19 = 0;
    iVar25 = 4;
    do {
      iVar20 = (int)uVar21;
      if (iVar20 < iVar30) {
        uVar21 = (ulong)(iVar20 + 1);
        uVar24 = (uint)local_228.data[iVar20];
      }
      else {
        uVar24 = 0;
      }
      uVar19 = uVar19 << 8 | uVar24;
      iVar25 = iVar25 + -1;
    } while (iVar25 != 0);
    local_228.cursor = (int)uVar21;
    fVar33 = (float)(int)uVar19 * 1.5258789e-05;
    goto LAB_00168292;
  }
  uVar22 = 0;
LAB_00168d41:
  uVar21 = (ulong)(uint)local_228.cursor;
  uVar17 = (ulong)(uint)local_228.size;
  if (local_228.size <= local_228.cursor) {
    return 0;
  }
  goto LAB_00168122;
}

Assistant:

static int stbtt__run_charstring(const stbtt_fontinfo *info, int glyph_index, stbtt__csctx *c)
{
   int in_header = 1, maskbits = 0, subr_stack_height = 0, sp = 0, v, i, b0;
   int has_subrs = 0, clear_stack;
   float s[48];
   stbtt__buf subr_stack[10], subrs = info->subrs, b;
   float f;

#define STBTT__CSERR(s) (0)

   // this currently ignores the initial width value, which isn't needed if we have hmtx
   b = stbtt__cff_index_get(info->charstrings, glyph_index);
   while (b.cursor < b.size) {
      i = 0;
      clear_stack = 1;
      b0 = stbtt__buf_get8(&b);
      switch (b0) {
      // @TODO implement hinting
      case 0x13: // hintmask
      case 0x14: // cntrmask
         if (in_header)
            maskbits += (sp / 2); // implicit "vstem"
         in_header = 0;
         stbtt__buf_skip(&b, (maskbits + 7) / 8);
         break;

      case 0x01: // hstem
      case 0x03: // vstem
      case 0x12: // hstemhm
      case 0x17: // vstemhm
         maskbits += (sp / 2);
         break;

      case 0x15: // rmoveto
         in_header = 0;
         if (sp < 2) return STBTT__CSERR("rmoveto stack");
         stbtt__csctx_rmove_to(c, s[sp-2], s[sp-1]);
         break;
      case 0x04: // vmoveto
         in_header = 0;
         if (sp < 1) return STBTT__CSERR("vmoveto stack");
         stbtt__csctx_rmove_to(c, 0, s[sp-1]);
         break;
      case 0x16: // hmoveto
         in_header = 0;
         if (sp < 1) return STBTT__CSERR("hmoveto stack");
         stbtt__csctx_rmove_to(c, s[sp-1], 0);
         break;

      case 0x05: // rlineto
         if (sp < 2) return STBTT__CSERR("rlineto stack");
         for (; i + 1 < sp; i += 2)
            stbtt__csctx_rline_to(c, s[i], s[i+1]);
         break;

      // hlineto/vlineto and vhcurveto/hvcurveto alternate horizontal and vertical
      // starting from a different place.

      case 0x07: // vlineto
         if (sp < 1) return STBTT__CSERR("vlineto stack");
         goto vlineto;
      case 0x06: // hlineto
         if (sp < 1) return STBTT__CSERR("hlineto stack");
         for (;;) {
            if (i >= sp) break;
            stbtt__csctx_rline_to(c, s[i], 0);
            i++;
      vlineto:
            if (i >= sp) break;
            stbtt__csctx_rline_to(c, 0, s[i]);
            i++;
         }
         break;

      case 0x1F: // hvcurveto
         if (sp < 4) return STBTT__CSERR("hvcurveto stack");
         goto hvcurveto;
      case 0x1E: // vhcurveto
         if (sp < 4) return STBTT__CSERR("vhcurveto stack");
         for (;;) {
            if (i + 3 >= sp) break;
            stbtt__csctx_rccurve_to(c, 0, s[i], s[i+1], s[i+2], s[i+3], (sp - i == 5) ? s[i + 4] : 0.0f);
            i += 4;
      hvcurveto:
            if (i + 3 >= sp) break;
            stbtt__csctx_rccurve_to(c, s[i], 0, s[i+1], s[i+2], (sp - i == 5) ? s[i+4] : 0.0f, s[i+3]);
            i += 4;
         }
         break;

      case 0x08: // rrcurveto
         if (sp < 6) return STBTT__CSERR("rcurveline stack");
         for (; i + 5 < sp; i += 6)
            stbtt__csctx_rccurve_to(c, s[i], s[i+1], s[i+2], s[i+3], s[i+4], s[i+5]);
         break;

      case 0x18: // rcurveline
         if (sp < 8) return STBTT__CSERR("rcurveline stack");
         for (; i + 5 < sp - 2; i += 6)
            stbtt__csctx_rccurve_to(c, s[i], s[i+1], s[i+2], s[i+3], s[i+4], s[i+5]);
         if (i + 1 >= sp) return STBTT__CSERR("rcurveline stack");
         stbtt__csctx_rline_to(c, s[i], s[i+1]);
         break;

      case 0x19: // rlinecurve
         if (sp < 8) return STBTT__CSERR("rlinecurve stack");
         for (; i + 1 < sp - 6; i += 2)
            stbtt__csctx_rline_to(c, s[i], s[i+1]);
         if (i + 5 >= sp) return STBTT__CSERR("rlinecurve stack");
         stbtt__csctx_rccurve_to(c, s[i], s[i+1], s[i+2], s[i+3], s[i+4], s[i+5]);
         break;

      case 0x1A: // vvcurveto
      case 0x1B: // hhcurveto
         if (sp < 4) return STBTT__CSERR("(vv|hh)curveto stack");
         f = 0.0;
         if (sp & 1) { f = s[i]; i++; }
         for (; i + 3 < sp; i += 4) {
            if (b0 == 0x1B)
               stbtt__csctx_rccurve_to(c, s[i], f, s[i+1], s[i+2], s[i+3], 0.0);
            else
               stbtt__csctx_rccurve_to(c, f, s[i], s[i+1], s[i+2], 0.0, s[i+3]);
            f = 0.0;
         }
         break;

      case 0x0A: // callsubr
         if (!has_subrs) {
            if (info->fdselect.size)
               subrs = stbtt__cid_get_glyph_subrs(info, glyph_index);
            has_subrs = 1;
         }
         // fallthrough
      case 0x1D: // callgsubr
         if (sp < 1) return STBTT__CSERR("call(g|)subr stack");
         v = (int) s[--sp];
         if (subr_stack_height >= 10) return STBTT__CSERR("recursion limit");
         subr_stack[subr_stack_height++] = b;
         b = stbtt__get_subr(b0 == 0x0A ? subrs : info->gsubrs, v);
         if (b.size == 0) return STBTT__CSERR("subr not found");
         b.cursor = 0;
         clear_stack = 0;
         break;

      case 0x0B: // return
         if (subr_stack_height <= 0) return STBTT__CSERR("return outside subr");
         b = subr_stack[--subr_stack_height];
         clear_stack = 0;
         break;

      case 0x0E: // endchar
         stbtt__csctx_close_shape(c);
         return 1;

      case 0x0C: { // two-byte escape
         float dx1, dx2, dx3, dx4, dx5, dx6, dy1, dy2, dy3, dy4, dy5, dy6;
         float dx, dy;
         int b1 = stbtt__buf_get8(&b);
         switch (b1) {
         // @TODO These "flex" implementations ignore the flex-depth and resolution,
         // and always draw beziers.
         case 0x22: // hflex
            if (sp < 7) return STBTT__CSERR("hflex stack");
            dx1 = s[0];
            dx2 = s[1];
            dy2 = s[2];
            dx3 = s[3];
            dx4 = s[4];
            dx5 = s[5];
            dx6 = s[6];
            stbtt__csctx_rccurve_to(c, dx1, 0, dx2, dy2, dx3, 0);
            stbtt__csctx_rccurve_to(c, dx4, 0, dx5, -dy2, dx6, 0);
            break;

         case 0x23: // flex
            if (sp < 13) return STBTT__CSERR("flex stack");
            dx1 = s[0];
            dy1 = s[1];
            dx2 = s[2];
            dy2 = s[3];
            dx3 = s[4];
            dy3 = s[5];
            dx4 = s[6];
            dy4 = s[7];
            dx5 = s[8];
            dy5 = s[9];
            dx6 = s[10];
            dy6 = s[11];
            //fd is s[12]
            stbtt__csctx_rccurve_to(c, dx1, dy1, dx2, dy2, dx3, dy3);
            stbtt__csctx_rccurve_to(c, dx4, dy4, dx5, dy5, dx6, dy6);
            break;

         case 0x24: // hflex1
            if (sp < 9) return STBTT__CSERR("hflex1 stack");
            dx1 = s[0];
            dy1 = s[1];
            dx2 = s[2];
            dy2 = s[3];
            dx3 = s[4];
            dx4 = s[5];
            dx5 = s[6];
            dy5 = s[7];
            dx6 = s[8];
            stbtt__csctx_rccurve_to(c, dx1, dy1, dx2, dy2, dx3, 0);
            stbtt__csctx_rccurve_to(c, dx4, 0, dx5, dy5, dx6, -(dy1+dy2+dy5));
            break;

         case 0x25: // flex1
            if (sp < 11) return STBTT__CSERR("flex1 stack");
            dx1 = s[0];
            dy1 = s[1];
            dx2 = s[2];
            dy2 = s[3];
            dx3 = s[4];
            dy3 = s[5];
            dx4 = s[6];
            dy4 = s[7];
            dx5 = s[8];
            dy5 = s[9];
            dx6 = dy6 = s[10];
            dx = dx1+dx2+dx3+dx4+dx5;
            dy = dy1+dy2+dy3+dy4+dy5;
            if (STBTT_fabs(dx) > STBTT_fabs(dy))
               dy6 = -dy;
            else
               dx6 = -dx;
            stbtt__csctx_rccurve_to(c, dx1, dy1, dx2, dy2, dx3, dy3);
            stbtt__csctx_rccurve_to(c, dx4, dy4, dx5, dy5, dx6, dy6);
            break;

         default:
            return STBTT__CSERR("unimplemented");
         }
      } break;

      default:
         if (b0 != 255 && b0 != 28 && (b0 < 32 || b0 > 254))
            return STBTT__CSERR("reserved operator");

         // push immediate
         if (b0 == 255) {
            f = (float)(stbtt_int32)stbtt__buf_get32(&b) / 0x10000;
         } else {
            stbtt__buf_skip(&b, -1);
            f = (float)(stbtt_int16)stbtt__cff_int(&b);
         }
         if (sp >= 48) return STBTT__CSERR("push stack overflow");
         s[sp++] = f;
         clear_stack = 0;
         break;
      }
      if (clear_stack) sp = 0;
   }
   return STBTT__CSERR("no endchar");

#undef STBTT__CSERR
}